

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

waiter * nsync::nsync_dll_waiter_(nsync_dll_element_ *e)

{
  void *pvVar1;
  
  pvVar1 = e->container;
  if ((*(byte *)((long)pvVar1 + 0x30) & 1) == 0) {
    _DAT_00000000 = 0;
  }
  if (((waiter *)((long)pvVar1 + -0x108))->tag != 0x590239f) {
    _DAT_00000000 = 0;
  }
  if ((nsync_dll_element_ *)((long)pvVar1 + 8) != e) {
    _DAT_00000000 = 0;
  }
  return (waiter *)((long)pvVar1 + -0x108);
}

Assistant:

waiter *nsync_dll_waiter_ (nsync_dll_element_ *e) {
	struct nsync_waiter_s *nw = DLL_NSYNC_WAITER (e);
	waiter *w = CONTAINER (waiter, nw, nw);
	ASSERT ((nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0);
	ASSERT (w->tag == WAITER_TAG);
	ASSERT (e == &w->nw.q);
	return (w);
}